

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridSequence.hpp
# Opt level: O2

void __thiscall TasGrid::GridSequence::loadGpuSurpluses<float>(GridSequence *this)

{
  __uniq_ptr_impl<TasGrid::CudaSequenceData<float>,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
  __p;
  CudaSequenceData<float> *this_00;
  __uniq_ptr_impl<TasGrid::CudaSequenceData<float>,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
  local_20;
  
  this_00 = (this->gpu_cachef)._M_t.
            super___uniq_ptr_impl<TasGrid::CudaSequenceData<float>,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_TasGrid::CudaSequenceData<float>_*,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
            .super__Head_base<0UL,_TasGrid::CudaSequenceData<float>_*,_false>._M_head_impl;
  if (this_00 == (CudaSequenceData<float> *)0x0) {
    Utils::make_unique<TasGrid::CudaSequenceData<float>>();
    __p._M_t.
    super__Tuple_impl<0UL,_TasGrid::CudaSequenceData<float>_*,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
    .super__Head_base<0UL,_TasGrid::CudaSequenceData<float>_*,_false>._M_head_impl =
         local_20._M_t.
         super__Tuple_impl<0UL,_TasGrid::CudaSequenceData<float>_*,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
         .super__Head_base<0UL,_TasGrid::CudaSequenceData<float>_*,_false>._M_head_impl;
    local_20._M_t.
    super__Tuple_impl<0UL,_TasGrid::CudaSequenceData<float>_*,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
    .super__Head_base<0UL,_TasGrid::CudaSequenceData<float>_*,_false>._M_head_impl =
         (tuple<TasGrid::CudaSequenceData<float>_*,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
          )(_Tuple_impl<0UL,_TasGrid::CudaSequenceData<float>_*,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
            )0x0;
    std::
    __uniq_ptr_impl<TasGrid::CudaSequenceData<float>,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
    ::reset((__uniq_ptr_impl<TasGrid::CudaSequenceData<float>,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
             *)&this->gpu_cachef,
            (pointer)__p._M_t.
                     super__Tuple_impl<0UL,_TasGrid::CudaSequenceData<float>_*,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
                     .super__Head_base<0UL,_TasGrid::CudaSequenceData<float>_*,_false>._M_head_impl)
    ;
    ::std::
    unique_ptr<TasGrid::CudaSequenceData<float>,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
    ::~unique_ptr((unique_ptr<TasGrid::CudaSequenceData<float>,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
                   *)&local_20);
    this_00 = (this->gpu_cachef)._M_t.
              super___uniq_ptr_impl<TasGrid::CudaSequenceData<float>,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_TasGrid::CudaSequenceData<float>_*,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
              .super__Head_base<0UL,_TasGrid::CudaSequenceData<float>_*,_false>._M_head_impl;
  }
  if ((this_00->surpluses).num_entries == 0) {
    GpuVector<float>::
    load<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>>
              (&this_00->surpluses,(this->super_BaseCanonicalGrid).acceleration,
               (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
               (this->surpluses).vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,
               (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
               (this->surpluses).vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void loadGpuSurpluses() const{
        auto& ccache = getGpuCache<T>();
        if (!ccache) ccache = Utils::make_unique<CudaSequenceData<T>>();
        if (ccache->surpluses.empty()) ccache->surpluses.load(acceleration, surpluses.begin(), surpluses.end());
    }